

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O2

int ec_cmp_parameters(EVP_PKEY *a,EVP_PKEY *b)

{
  EC_KEY *key;
  int iVar1;
  EC_GROUP *a_00;
  EC_GROUP *b_00;
  uint uVar2;
  
  key = (EC_KEY *)b->pkey;
  uVar2 = 0xfffffffe;
  if (key != (EC_KEY *)0x0 && (EC_KEY *)a->pkey != (EC_KEY *)0x0) {
    a_00 = EC_KEY_get0_group((EC_KEY *)a->pkey);
    b_00 = EC_KEY_get0_group(key);
    if (b_00 != (EC_GROUP *)0x0 && a_00 != (EC_GROUP *)0x0) {
      iVar1 = EC_GROUP_cmp(a_00,b_00,(BN_CTX *)0x0);
      uVar2 = (uint)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

static int ec_cmp_parameters(const EVP_PKEY *a, const EVP_PKEY *b) {
  const EC_KEY *a_ec = reinterpret_cast<const EC_KEY *>(a->pkey);
  const EC_KEY *b_ec = reinterpret_cast<const EC_KEY *>(b->pkey);
  if (a_ec == NULL || b_ec == NULL) {
    return -2;
  }
  const EC_GROUP *group_a = EC_KEY_get0_group(a_ec),
                 *group_b = EC_KEY_get0_group(b_ec);
  if (group_a == NULL || group_b == NULL) {
    return -2;
  }
  if (EC_GROUP_cmp(group_a, group_b, NULL) != 0) {
    // mismatch
    return 0;
  }
  return 1;
}